

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::Arith2Inst::display(Arith2Inst *this,ostream *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  undefined8 extraout_RDX;
  
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  std::operator<<(o," ");
  display_reg_name(o,this->r1);
  if ((this->super_Inst).op == Bx) {
    return;
  }
  poVar1 = std::operator<<(o,", ");
  UNRECOVERED_JUMPTABLE = *(this->r2).super_Displayable._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(&this->r2,poVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void Arith2Inst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, r1);
  if (op != OpCode::Bx) {
    o << ", " << r2;
  }
}